

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMemCheckHandler::GenerateCTestXML(cmCTestMemCheckHandler *this,cmXMLWriter *xml)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmCTest *pcVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  long lVar10;
  ostream *poVar11;
  pointer piVar12;
  size_type *psVar13;
  char *pcVar14;
  ulong uVar15;
  pointer pcVar16;
  cmCTestTestResult *result;
  pointer pcVar17;
  int iVar18;
  string output;
  string outname;
  vector<int,_std::allocator<int>_> memcheckresults;
  string testPath;
  string local_238;
  string local_218;
  vector<int,_std::allocator<int>_> local_1f8;
  ulong local_1e0;
  cmCTestTestResult *local_1d8;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  long local_58;
  long *local_50;
  long local_40 [2];
  
  bVar7 = cmCTest::GetProduceXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest)
  ;
  if (!bVar7) {
    return;
  }
  cmCTest::StartXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml,
                    (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.AppendXML);
  cmCTest::GenerateSubprojectsOutput
            ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml);
  pcVar17 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"DynamicAnalysis","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  switch(this->MemoryTesterStyle) {
  case 1:
    pcVar14 = "Valgrind";
    goto LAB_001ae784;
  case 2:
    cmXMLWriter::Attribute<char[7]>(xml,"Checker",(char (*) [7])0x74f38e);
    break;
  case 3:
    pcVar14 = "DrMemory";
LAB_001ae784:
    cmXMLWriter::Attribute<char[9]>(xml,"Checker",(char (*) [9])pcVar14);
    break;
  case 4:
    pcVar14 = "BoundsChecker";
    goto LAB_001ae7ef;
  case 5:
    pcVar14 = "CudaSanitizer";
    goto LAB_001ae7ef;
  case 6:
    cmXMLWriter::Attribute<char[17]>(xml,"Checker",(char (*) [17])"AddressSanitizer");
    break;
  case 7:
    pcVar14 = "LeakSanitizer";
LAB_001ae7ef:
    cmXMLWriter::Attribute<char[14]>(xml,"Checker",(char (*) [14])pcVar14);
    break;
  case 8:
    pcVar14 = "ThreadSanitizer";
    goto LAB_001ae81f;
  case 9:
    pcVar14 = "MemorySanitizer";
LAB_001ae81f:
    cmXMLWriter::Attribute<char[16]>(xml,"Checker",(char (*) [16])pcVar14);
    break;
  case 10:
    cmXMLWriter::Attribute<char[27]>(xml,"Checker",(char (*) [27])"UndefinedBehaviorSanitizer");
    break;
  default:
    cmXMLWriter::Attribute<char[8]>(xml,"Checker",(char (*) [8])0x7bcdd9);
  }
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"StartDateTime","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&(this->super_cmCTestTestHandler).StartTest);
  cmXMLWriter::EndElement(xml);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"StartTestTime","");
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,(string *)local_1d0,&(this->super_cmCTestTestHandler).StartTestTime);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"TestList","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  pcVar16 = (this->super_cmCTestTestHandler).TestResults.
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (this->super_cmCTestTestHandler).TestResults.
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar16 != pcVar3) {
    paVar2 = &local_238.field_2;
    do {
      pcVar4 = (pcVar16->Path)._M_dataplus._M_p;
      local_238._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar4,pcVar4 + (pcVar16->Path)._M_string_length);
      std::__cxx11::string::append((char *)&local_238);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_238,(ulong)(pcVar16->Name)._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar13) {
        local_1d0._16_8_ = *psVar13;
        local_1d0._24_8_ = plVar9[3];
        local_1d0._0_8_ = pcVar17;
      }
      else {
        local_1d0._16_8_ = *psVar13;
        local_1d0._0_8_ = (size_type *)*plVar9;
      }
      local_1d0._8_8_ = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      local_238._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Test","");
      cmCTest::GetShortPathToFile
                (&local_218,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,
                 (string *)local_1d0);
      cmXMLWriter::StartElement(xml,&local_238);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_218);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_1d0._0_8_ != pcVar17) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar3);
  }
  cmXMLWriter::EndElement(xml);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,"-- Processing memory checking output:\n",0x26);
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x169,local_238._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  pcVar16 = (this->super_cmCTestTestHandler).TestResults.
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->super_cmCTestTestHandler).TestResults.
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16;
  if (lVar10 != 0) {
    local_58 = (lVar10 >> 4) * -0x2c8590b21642c859;
    uVar15 = 0;
    do {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1f8,
                 (long)(this->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (value_type_conflict2 *)local_1d0,(allocator_type *)&local_218);
      result = pcVar16 + uVar15;
      bVar7 = ProcessMemCheckOutput(this,&result->Output,&local_238,&local_1f8);
      if (!bVar7 || result->Status != 9) {
        cmCTestTestHandler::CleanTestOutput
                  (&this->super_cmCTestTestHandler,&local_238,
                   (long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize,
                   (this->super_cmCTestTestHandler).TestOutputTruncation);
        cmCTestTestHandler::WriteTestResultHeader(&this->super_cmCTestTestHandler,xml,result);
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Results","");
        cmXMLWriter::StartElement(xml,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        local_1e0 = uVar15;
        local_1d8 = result;
        if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          iVar18 = 0;
        }
        else {
          lVar10 = 0;
          uVar15 = 0;
          iVar18 = 0;
          do {
            if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15] != 0) {
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Defect","");
              cmXMLWriter::StartElement(xml,(string *)local_1d0);
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
              }
              cmXMLWriter::Attribute<std::__cxx11::string>
                        (xml,"type",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(((this->ResultStringsLong).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar10));
              result = local_1d8;
              piVar12 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              cmXMLWriter::PreContent(xml);
              std::ostream::operator<<(xml->Output,piVar12[uVar15]);
              iVar18 = iVar18 + local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar15];
              cmXMLWriter::EndElement(xml);
            }
            piVar1 = (this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar15;
            *piVar1 = *piVar1 + local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar15];
            uVar15 = uVar15 + 1;
            lVar10 = lVar10 + 0x20;
          } while (uVar15 < (ulong)((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        cmXMLWriter::EndElement(xml);
        uVar15 = local_1e0;
        if (0 < iVar18) {
          iVar8 = cmCTest::GetMaxTestNameWidth
                            ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          pcVar17 = (result->Name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,pcVar17,pcVar17 + (result->Name)._M_string_length);
          std::__cxx11::string::append((char *)&local_218);
          std::__cxx11::string::resize((ulong)&local_218,(char)iVar8 + '\x04');
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          result = local_1d8;
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," MemCheck: #",0xc);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,result->TestCount);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_218._M_dataplus._M_p,local_218._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   Defects: ",0xc);
          plVar9 = (long *)std::ostream::operator<<(poVar11,iVar18);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,399,(char *)local_50,
                       (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
          uVar15 = local_1e0;
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
        }
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Log","");
        cmXMLWriter::StartElement(xml,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        bVar7 = cmCTest::ShouldCompressTestOutput
                          ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
        if (bVar7) {
          cmCTest::CompressString
                    ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,&local_238);
          cmXMLWriter::Attribute<char[5]>(xml,"compression",(char (*) [5])0x7b946b);
          cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_238);
        cmXMLWriter::EndElement(xml);
        cmCTestTestHandler::WriteTestResultFooter(&this->super_cmCTestTestHandler,xml,result);
      }
      if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      uVar15 = uVar15 + 1;
      pcVar16 = (this->super_cmCTestTestHandler).TestResults.
                super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)(((long)(this->super_cmCTestTestHandler).TestResults.
                                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4
                              ) * -0x2c8590b21642c859));
  }
  pcVar17 = local_1d0 + 0x10;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,
             "MemCheck log files can be found here: (<#> corresponds to test number)",0x46);
  std::ios::widen((char)(ostringstream *)local_1d0 + (char)*(undefined8 *)(local_1d0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1d0);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a0,local_238._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  pcVar4 = (this->MemoryTesterOutputFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + (this->MemoryTesterOutputFile)._M_string_length);
  cmsys::SystemTools::ReplaceString(&local_238,"??","<#>");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a4,local_218._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,"Memory checking results:",0x18);
  std::ios::widen((char)(ostream *)local_1d0 + (char)*(undefined8 *)(local_1d0._0_8_ + -0x18));
  std::ostream::put((char)local_1d0);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a6,local_218._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"DefectList","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  piVar12 = (this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar12) {
    lVar10 = 0;
    uVar15 = 0;
    do {
      if (piVar12[uVar15] != 0) {
        *(undefined8 *)(SSL_CTX_set_alpn_protos + *(long *)(std::cerr + -0x18)) = 0x23;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        pbVar6 = (this->ResultStringsLong).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,
                             *(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar10),
                             *(long *)((long)&pbVar6->_M_string_length + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," - ",3);
        plVar9 = (long *)std::ostream::operator<<
                                   (poVar11,(this->GlobalResults).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar15]);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x1ae,local_218._M_dataplus._M_p,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        local_1d0._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Defect","");
        cmXMLWriter::StartElement(xml,(string *)local_1d0);
        if ((pointer)local_1d0._0_8_ != pcVar17) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"Type",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((this->ResultStringsLong).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10)
                  );
        cmXMLWriter::EndElement(xml);
      }
      uVar15 = uVar15 + 1;
      piVar12 = (this->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
    } while (uVar15 < (ulong)((long)(this->GlobalResults).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar12 >> 2));
  }
  cmXMLWriter::EndElement(xml);
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"EndDateTime","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&(this->super_cmCTestTestHandler).EndTest);
  cmXMLWriter::EndElement(xml);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"EndTestTime","");
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,(string *)local_1d0,&(this->super_cmCTestTestHandler).EndTestTime);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"ElapsedMinutes","");
  local_218._M_dataplus._M_p =
       (pointer)(long)((this->super_cmCTestTestHandler).ElapsedTestingTime.__r / 60.0);
  cmXMLWriter::Element<long>(xml,(string *)local_1d0,(long *)&local_218);
  if ((pointer)local_1d0._0_8_ != pcVar17) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  cmXMLWriter::EndElement(xml);
  cmCTest::EndXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("DynamicAnalysis");
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      xml.Attribute("Checker", "Valgrind");
      break;
    case cmCTestMemCheckHandler::DRMEMORY:
      xml.Attribute("Checker", "DrMemory");
      break;
    case cmCTestMemCheckHandler::PURIFY:
      xml.Attribute("Checker", "Purify");
      break;
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      xml.Attribute("Checker", "BoundsChecker");
      break;
    case cmCTestMemCheckHandler::CUDA_SANITIZER:
      xml.Attribute("Checker", "CudaSanitizer");
      break;
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      xml.Attribute("Checker", "AddressSanitizer");
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      xml.Attribute("Checker", "LeakSanitizer");
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      xml.Attribute("Checker", "ThreadSanitizer");
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      xml.Attribute("Checker", "MemorySanitizer");
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      xml.Attribute("Checker", "UndefinedBehaviorSanitizer");
      break;
    default:
      xml.Attribute("Checker", "Unknown");
  }

  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  cmCTestMemCheckHandler::TestResultsVector::size_type cc;
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "-- Processing memory checking output:\n", this->Quiet);
  size_t total = this->TestResults.size();
  for (cc = 0; cc < this->TestResults.size(); cc++) {
    cmCTestTestResult const& result = this->TestResults[cc];
    std::string memcheckstr;
    std::vector<int> memcheckresults(this->ResultStrings.size(), 0);
    bool res =
      this->ProcessMemCheckOutput(result.Output, memcheckstr, memcheckresults);
    if (res && result.Status == cmCTestMemCheckHandler::COMPLETED) {
      continue;
    }
    this->CleanTestOutput(
      memcheckstr,
      static_cast<size_t>(this->CustomMaximumFailedTestOutputSize),
      this->TestOutputTruncation);
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");
    int memoryErrors = 0;
    for (std::vector<int>::size_type kk = 0; kk < memcheckresults.size();
         ++kk) {
      if (memcheckresults[kk]) {
        xml.StartElement("Defect");
        xml.Attribute("type", this->ResultStringsLong[kk]);
        xml.Content(memcheckresults[kk]);
        memoryErrors += memcheckresults[kk];
        xml.EndElement(); // Defect
      }
      this->GlobalResults[kk] += memcheckresults[kk];
    }
    xml.EndElement(); // Results
    if (memoryErrors > 0) {
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      std::string outname = result.Name + " ";
      outname.resize(maxTestNameWidth + 4, '.');
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         cc + 1 << "/" << total << " MemCheck: #"
                                << result.TestCount << ": " << outname
                                << "   Defects: " << memoryErrors << std::endl,
                         this->Quiet);
    }
    xml.StartElement("Log");
    if (this->CTest->ShouldCompressTestOutput()) {
      this->CTest->CompressString(memcheckstr);
      xml.Attribute("compression", "gzip");
      xml.Attribute("encoding", "base64");
    }
    xml.Content(memcheckstr);
    xml.EndElement(); // Log

    this->WriteTestResultFooter(xml, result);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "MemCheck log files can be found here: "
                     "(<#> corresponds to test number)"
                       << std::endl,
                     this->Quiet);
  std::string output = this->MemoryTesterOutputFile;
  cmSystemTools::ReplaceString(output, "??", "<#>");
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, output << std::endl,
                     this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Memory checking results:" << std::endl, this->Quiet);
  xml.StartElement("DefectList");
  for (cc = 0; cc < this->GlobalResults.size(); cc++) {
    if (this->GlobalResults[cc]) {
      std::cerr.width(35);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         this->ResultStringsLong[cc]
                           << " - " << this->GlobalResults[cc] << std::endl,
                         this->Quiet);
      xml.StartElement("Defect");
      xml.Attribute("Type", this->ResultStringsLong[cc]);
      xml.EndElement();
    }
  }
  xml.EndElement(); // DefectList

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());

  xml.EndElement(); // DynamicAnalysis
  this->CTest->EndXML(xml);
}